

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LatencyDecodingSynapse.cpp
# Opt level: O2

void __thiscall LatencyDecodingSynapse::update(LatencyDecodingSynapse *this)

{
  VectorXd *this_00;
  double dVar1;
  double dVar2;
  Event *pEVar3;
  Population *pPVar4;
  Scalar *pSVar5;
  int i;
  ulong index;
  double dVar6;
  Scalar local_30;
  
  dVar1 = this->currentWindow;
  dVar2 = this->param->window_length_s;
  dVar6 = Clock::getCurrentTime(this->clock);
  if (dVar1 + dVar2 <= dVar6) {
    local_30 = -1.0;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
              ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&this->spikeTimes,&local_30);
    this->currentWindow = this->param->window_length_s + this->currentWindow;
  }
  this_00 = &this->spikeTimes;
  for (index = 0; (long)index < (long)this->inputSize; index = index + 1) {
    pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,index)
    ;
    if ((*pSVar5 <= 0.0 && *pSVar5 != 0.0) &&
       (pEVar3 = (((this->super_Synapse).from_population)->output).
                 super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
                 super__Vector_impl_data._M_start[index], pEVar3->type == Spike)) {
      dVar1 = pEVar3->eventTime;
      dVar2 = this->currentWindow;
      dVar6 = this->param->window_length_s;
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          index);
      *pSVar5 = ((dVar1 - dVar2) / dVar6 + -0.1) * 1.25;
      pEVar3 = (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
               super__Vector_impl_data._M_start[index];
      pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)this_00,
                          index);
      pEVar3[1]._vptr_Event = (_func_int **)*pSVar5;
    }
    pPVar4 = (this->super_Synapse).to_population;
    (*pPVar4->_vptr_Population[5])
              (pPVar4,index & 0xffffffff,
               (this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>._M_impl.
               super__Vector_impl_data._M_start[index]);
    Logging::logValue(this->logger,(long)this,(int)index,3,
                      (double)(this->output).super__Vector_base<Event_*,_std::allocator<Event_*>_>.
                              _M_impl.super__Vector_impl_data._M_start[index][1]._vptr_Event);
  }
  return;
}

Assistant:

void LatencyDecodingSynapse::update() {
    if(currentWindow + param->window_length_s <= clock->getCurrentTime()) {
        spikeTimes.setConstant(-1);
        currentWindow += param->window_length_s;
    }
    for(int i = 0; i < inputSize; i++) {
        if(spikeTimes(i) < 0 && from_population->output[i]->type == EventType::Spike) {      
            double s0 = from_population->output[i]->eventTime - currentWindow;
            s0 = s0/param->window_length_s;
            spikeTimes(i) = (s0 - 0.1) * 1.25;
            static_cast<ValueEvent*>(output[i])->setValue(spikeTimes(i));
            
        }
        to_population->setInput(i, output[i]);
        logger->logValue((long)this, i, EventType::Value, static_cast<ValueEvent*>(output[i])->value);
    }
}